

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

success<toml::basic_value<toml::type_config>_> * __thiscall
toml::ok<toml::basic_value<toml::type_config>>
          (success<toml::basic_value<toml::type_config>_> *__return_storage_ptr__,toml *this,
          basic_value<toml::type_config> *v)

{
  basic_value<toml::type_config> bStack_d8;
  
  basic_value<toml::type_config>::basic_value(&bStack_d8,(basic_value<toml::type_config> *)this);
  basic_value<toml::type_config>::basic_value(&__return_storage_ptr__->value,&bStack_d8);
  basic_value<toml::type_config>::~basic_value(&bStack_d8);
  return __return_storage_ptr__;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}